

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_caseJump
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t value,sysbvm_tuple_t caseKeys,sysbvm_tuple_t caseDestinations,
          sysbvm_tuple_t defaultDestination)

{
  size_t sVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t instruction;
  size_t i_1;
  size_t i;
  size_t operandIndex;
  sysbvm_tuple_t operands;
  size_t caseCount;
  sysbvm_tuple_t defaultDestination_local;
  sysbvm_tuple_t caseDestinations_local;
  sysbvm_tuple_t caseKeys_local;
  sysbvm_tuple_t value_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_array_getSize(caseKeys);
  sVar2 = sysbvm_array_getSize(caseDestinations);
  if (sVar1 != sVar2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:576: assertion failure: caseCount == sysbvm_array_getSize(caseDestinations)"
              );
  }
  sysbvm_functionBytecodeAssembler_countExtension(context,assembler,sVar1 >> 4);
  sVar3 = sysbvm_array_create(context,sVar1 * 2 + 2);
  sysbvm_array_atPut(sVar3,0,value);
  i = 1;
  for (i_1 = 0; i_1 < sVar1; i_1 = i_1 + 1) {
    sVar4 = sysbvm_array_at(caseKeys,i_1);
    sysbvm_array_atPut(sVar3,i,sVar4);
    i = i + 1;
  }
  for (instruction = 0; instruction < sVar1; instruction = instruction + 1) {
    sVar4 = sysbvm_array_at(caseDestinations,instruction);
    sysbvm_array_atPut(sVar3,i,sVar4);
    i = i + 1;
  }
  sysbvm_array_atPut(sVar3,i,defaultDestination);
  sVar3 = sysbvm_functionBytecodeAssemblerInstruction_create(context,0xe0,sVar3);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar3);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_caseJump(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t value, sysbvm_tuple_t caseKeys, sysbvm_tuple_t caseDestinations, sysbvm_tuple_t defaultDestination)
{
    size_t caseCount = sysbvm_array_getSize(caseKeys);
    SYSBVM_ASSERT(caseCount == sysbvm_array_getSize(caseDestinations));

    sysbvm_functionBytecodeAssembler_countExtension(context, assembler, caseCount>>4);

    sysbvm_tuple_t operands = sysbvm_array_create(context, 1 + caseCount + caseCount + 1);
    size_t operandIndex = 0;
    sysbvm_array_atPut(operands, operandIndex++, value);
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseKeys, i));
    for(size_t i = 0; i < caseCount; ++i)
        sysbvm_array_atPut(operands, operandIndex++, sysbvm_array_at(caseDestinations, i));
    sysbvm_array_atPut(operands, operandIndex++, defaultDestination);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_CASE_JUMP, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}